

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

bool __thiscall pg::DTLSolver::search(DTLSolver *this,int player)

{
  bitset *other;
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint64_t *puVar6;
  pointer piVar7;
  pointer piVar8;
  uint *puVar9;
  int *piVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  ostream *poVar14;
  Game *pGVar15;
  int iVar16;
  int *val;
  int *val_00;
  long lVar17;
  char *pcVar18;
  bool bVar19;
  int v_2;
  long lVar20;
  int v_3;
  int aiStack_c0 [4];
  ulong uStack_b0;
  undefined1 local_a8 [8];
  bitset V_1;
  bitset CurG;
  
  iVar2 = this->tangles;
  iVar3 = this->dominions;
  sVar5 = ((this->super_Solver).game)->n_vertices;
  uVar13 = sVar5 * 4 + 0xf & 0xfffffffffffffff0;
  val = (int *)(local_a8 + -uVar13);
  val_00 = (int *)((long)val - uVar13);
  iVar16 = (this->super_Solver).trace;
  val_00[-2] = 1;
  val_00[-1] = 0;
  lVar20 = *(long *)(val_00 + -2);
  if (iVar16 != 0) {
    val_00[-2] = 0x16542e;
    val_00[-1] = 0;
    bitset::bitset((bitset *)&V_1._allocsize,sVar5);
    pGVar15 = (this->super_Solver).game;
    puVar6 = (this->G)._bits;
    for (uVar13 = 0; (long)uVar13 < pGVar15->n_vertices; uVar13 = uVar13 + 1) {
      if (((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
         ((pGVar15->_priority[uVar13] & 1U) == player)) {
        puVar1 = (ulong *)(V_1._allocsize + (uVar13 >> 6) * 8);
        *puVar1 = *puVar1 | lVar20 << (uVar13 & 0x3f);
      }
    }
    val_00[-2] = 0x165491;
    val_00[-1] = 0;
    computeDistanceValues(this,(bitset *)&V_1._allocsize,&this->G,&this->G,val,player);
    val_00[-2] = 0x16549a;
    val_00[-1] = 0;
    bitset::~bitset((bitset *)&V_1._allocsize);
  }
  other = &this->G;
  val_00[-2] = 0x1654b1;
  val_00[-1] = 0;
  bitset::bitset((bitset *)&V_1._allocsize,other);
  val_00[-2] = 0x1654c5;
  val_00[-1] = 0;
  search_rec(this,(bitset *)&V_1._allocsize,player,0);
  sVar5 = (this->W)._bitssize;
  puVar6 = (this->W)._bits;
  for (lVar17 = 0; sVar5 << 3 != lVar17; lVar17 = lVar17 + 8) {
    *(undefined8 *)((long)puVar6 + lVar17) = 0;
  }
  piVar7 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar8) {
    puVar9 = (this->Q).queue;
    piVar10 = this->str;
    for (uVar13 = 0; (uVar13 & 0xffffffff) < (ulong)((long)piVar8 - (long)piVar7 >> 2);
        uVar13 = uVar13 + 2) {
      uVar4 = piVar7[uVar13 & 0xffffffff];
      piVar10[(int)uVar4] = piVar7[uVar13 + 1];
      iVar16 = (this->Q).pointer;
      (this->Q).pointer = iVar16 + 1;
      puVar9[iVar16] = uVar4;
    }
    (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar7;
    while( true ) {
      iVar16 = (this->Q).pointer;
      if ((long)iVar16 == 0) break;
      (this->Q).pointer = iVar16 + -1;
      uVar4 = (this->Q).queue[(long)iVar16 + -1];
      iVar16 = this->str[(int)uVar4];
      val_00[-2] = 0x1655a4;
      val_00[-1] = 0;
      Solver::solve(&this->super_Solver,uVar4,player,iVar16);
      puVar6 = (this->G)._bits;
      val_00[-2] = -2;
      val_00[-1] = -1;
      bVar11 = (byte)uVar4 & 0x3f;
      puVar1 = puVar6 + ((ulong)(long)(int)uVar4 >> 6);
      *puVar1 = *puVar1 & (*(ulong *)(val_00 + -2) << bVar11 |
                          *(ulong *)(val_00 + -2) >> 0x40 - bVar11);
      val_00[-4] = -1;
      val_00[-3] = -1;
      val_00[-6] = 0x1655dd;
      val_00[-5] = 0;
      attractVertices(this,player,uVar4,other,&this->S,other,val_00[-4]);
      val_00[-4] = -1;
      val_00[-3] = -1;
      val_00[-6] = 0x1655fd;
      val_00[-5] = 0;
      attractTangles(this,player,uVar4,other,&this->S,other,val_00[-4]);
    }
    sVar5 = (this->S)._bitssize;
    puVar6 = (this->S)._bits;
    val_00[-2] = 1;
    val_00[-1] = 0;
    lVar20 = *(long *)(val_00 + -2);
    for (lVar17 = 0; sVar5 << 3 != lVar17; lVar17 = lVar17 + 8) {
      *(undefined8 *)((long)puVar6 + lVar17) = 0;
    }
  }
  iVar16 = this->tangles;
  iVar12 = this->dominions;
  if (iVar12 == iVar3 && (iVar16 != iVar2 && 2 < (this->super_Solver).trace)) {
    sVar5 = ((this->super_Solver).game)->n_vertices;
    val_00[-2] = 0x165674;
    val_00[-1] = 0;
    bitset::bitset((bitset *)local_a8,sVar5);
    pGVar15 = (this->super_Solver).game;
    puVar6 = (this->G)._bits;
    for (uVar13 = 0; (long)uVar13 < pGVar15->n_vertices; uVar13 = uVar13 + 1) {
      if (((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
         ((pGVar15->_priority[uVar13] & 1U) == player)) {
        *(ulong *)((long)local_a8 + (uVar13 >> 6) * 8) =
             *(ulong *)((long)local_a8 + (uVar13 >> 6) * 8) | lVar20 << (uVar13 & 0x3f);
      }
    }
    val_00[-2] = 0x1656da;
    val_00[-1] = 0;
    computeDistanceValues(this,(bitset *)local_a8,other,other,val_00,player);
    lVar20 = 0;
    bVar19 = false;
    while( true ) {
      pGVar15 = (this->super_Solver).game;
      lVar17 = pGVar15->n_vertices;
      if (lVar17 <= lVar20) break;
      iVar16 = val[lVar20];
      iVar12 = val_00[lVar20];
      if (iVar16 != iVar12) {
        poVar14 = (this->super_Solver).logger;
        CurG._allocsize = (size_t)pGVar15;
        val_00[-2] = 0x16571a;
        val_00[-1] = 0;
        poVar14 = operator<<(poVar14,(_label_vertex *)&CurG._allocsize);
        val_00[-2] = 0x165729;
        val_00[-1] = 0;
        poVar14 = std::operator<<(poVar14,": ");
        val_00[-2] = 0x165734;
        val_00[-1] = 0;
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar16);
        val_00[-2] = 0x165743;
        val_00[-1] = 0;
        std::operator<<(poVar14," => ");
        poVar14 = (this->super_Solver).logger;
        if (iVar12 == 0x7fffffff) {
          pcVar18 = "MAX\n";
        }
        else {
          val_00[-2] = 0x165764;
          val_00[-1] = 0;
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar12);
          pcVar18 = "\n";
        }
        bVar19 = true;
        val_00[-2] = 0x165776;
        val_00[-1] = 0;
        std::operator<<(poVar14,pcVar18);
      }
      lVar20 = lVar20 + 1;
    }
    if (!bVar19) {
      for (lVar20 = 0; poVar14 = (this->super_Solver).logger, lVar20 < lVar17; lVar20 = lVar20 + 1)
      {
        CurG._allocsize = (size_t)pGVar15;
        val_00[-2] = 0x1657b2;
        val_00[-1] = 0;
        poVar14 = operator<<(poVar14,(_label_vertex *)&CurG._allocsize);
        val_00[-2] = 0x1657bd;
        val_00[-1] = 0;
        poVar14 = std::operator<<(poVar14,": ");
        iVar16 = val[lVar20];
        val_00[-2] = 0x1657cd;
        val_00[-1] = 0;
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar16);
        val_00[-2] = 0x1657d8;
        val_00[-1] = 0;
        std::operator<<(poVar14,"\n");
        pGVar15 = (this->super_Solver).game;
        lVar17 = pGVar15->n_vertices;
      }
      val_00[-2] = 0x1657f0;
      val_00[-1] = 0;
      std::operator<<(poVar14,"nothing changed!\n");
    }
    val_00[-2] = 0x1657fc;
    val_00[-1] = 0;
    bitset::~bitset((bitset *)local_a8);
    iVar12 = this->dominions;
    iVar16 = this->tangles;
  }
  val_00[-2] = 0x16581e;
  val_00[-1] = 0;
  bitset::~bitset((bitset *)&V_1._allocsize);
  return iVar12 != iVar3 || iVar16 != iVar2;
}

Assistant:

bool
DTLSolver::search(const int player)
{
    const int T = tangles;
    const int D = dominions;

#ifndef NDEBUG
    int val1[nodecount()], val2[nodecount()];
    if (trace) {
        bitset V(nodecount()); // the current V
        for (int v=0; v<nodecount(); v++) {
            if (G[v] and (priority(v)&1) == player) V[v] = true;
        }
        computeDistanceValues(V, G, G, val1, player);
    }
#endif

    bitset CurG(G);
    search_rec(CurG, player, 0);
    W.reset();

    /**
     * Extend any dominions that were found.
     * (Any solved vertices are now in <SQ>.)
     */

    if (!dom_vector.empty()) {
        for (unsigned i = 0; i<dom_vector.size(); i+=2) {
            int v = dom_vector[i];
            int s = dom_vector[i+1];
            str[v] = s;
            Q.push(v);
        }
        dom_vector.clear();

        while (Q.nonempty()) {
            const int v = Q.pop();
            Solver::solve(v, player, str[v]);
            G[v] = false; // remove from Game
            attractVertices(player, v, G, S, G, -1);
            attractTangles(player, v, G, S, G, -1);
        }
        S.reset();
    }

#ifndef NDEBUG
    if (trace >= 3) {
        if (tangles != T and dominions == D) {
            bitset V(nodecount()); // the current V
            for (int v=0; v<nodecount(); v++) {
                if (G[v] and (priority(v)&1) == player) V[v] = true;
            }
            computeDistanceValues(V, G, G, val2, player);
            bool a_change = false;
            for (int v=0; v<nodecount(); v++) {
                if (val1[v] != val2[v]) {
                    logger << label_vertex(v) << ": " << val1[v] << " => ";
                    if (val2[v] == INT_MAX)  logger << "MAX\n";
                    else logger << val2[v] << "\n";
                    a_change = true;
                }
            }
            if (!a_change) {
                for (int v=0; v<nodecount(); v++) logger << label_vertex(v) << ": " << val1[v] << "\n";
                logger << "nothing changed!\n";
                // throw "nothing changed!";
            }
        }
    }
#endif

    return tangles != T or dominions != D;
}